

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowAbove(ImGuiWindow *potential_above,ImGuiWindow *potential_below)

{
  ImGuiWindow *pIVar1;
  byte bVar2;
  long lVar3;
  
  bVar2 = 200;
  lVar3 = (long)(GImGui->Windows).Size;
  do {
    if (lVar3 < 1) {
      return false;
    }
    pIVar1 = (GImGui->Windows).Data[lVar3 + -1];
    bVar2 = bVar2 & pIVar1 != potential_below | pIVar1 == potential_above;
  } while ((pIVar1 != potential_below) && (lVar3 = lVar3 + -1, pIVar1 != potential_above));
  return (bool)bVar2;
}

Assistant:

bool ImGui::IsWindowAbove(ImGuiWindow* potential_above, ImGuiWindow* potential_below)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* candidate_window = g.Windows[i];
        if (candidate_window == potential_above)
            return true;
        if (candidate_window == potential_below)
            return false;
    }
    return false;
}